

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O2

void __thiscall
QGridLayoutEngine::QGridLayoutEngine
          (QGridLayoutEngine *this,Alignment defaultAlignment,bool snapToPixelGrid)

{
  (this->q_defaultSpacings).m_data[1].q_value = 0.0;
  (this->q_defaultSpacings).m_data[1].q_state = Default;
  (this->q_infos).m_data[0].count = 0;
  (this->q_infos).m_data[1].stretches.d.d = (Data *)0x0;
  (this->q_infos).m_data[1].stretches.d.ptr = (QStretchParameter *)0x0;
  (this->q_infos).m_data[1].stretches.d.size = 0;
  (this->q_infos).m_data[1].spacings.d.d = (Data *)0x0;
  (this->q_infos).m_data[1].spacings.d.ptr = (QLayoutParameter<double> *)0x0;
  (this->q_infos).m_data[1].spacings.d.size = 0;
  (this->q_infos).m_data[1].alignments.d.d = (Data *)0x0;
  (this->q_infos).m_data[1].alignments.d.ptr = (QFlags<Qt::AlignmentFlag> *)0x0;
  (this->q_infos).m_data[1].alignments.d.size = 0;
  (this->q_infos).m_data[1].boxes.d.d = (Data *)0x0;
  (this->q_infos).m_data[1].boxes.d.ptr = (QGridLayoutBox *)0x0;
  (this->q_infos).m_data[1].boxes.d.size = 0;
  (this->q_infos).m_data[0].stretches.d.d = (Data *)0x0;
  (this->q_infos).m_data[0].stretches.d.ptr = (QStretchParameter *)0x0;
  (this->q_infos).m_data[0].stretches.d.size = 0;
  (this->q_infos).m_data[0].spacings.d.d = (Data *)0x0;
  (this->q_infos).m_data[0].spacings.d.ptr = (QLayoutParameter<double> *)0x0;
  (this->q_infos).m_data[0].spacings.d.size = 0;
  (this->q_infos).m_data[0].alignments.d.d = (Data *)0x0;
  (this->q_infos).m_data[0].alignments.d.ptr = (QFlags<Qt::AlignmentFlag> *)0x0;
  (this->q_infos).m_data[0].alignments.d.size = 0;
  (this->q_infos).m_data[0].boxes.d.d = (Data *)0x0;
  (this->q_infos).m_data[0].boxes.d.ptr = (QGridLayoutBox *)0x0;
  (this->q_infos).m_data[0].boxes.d.size = 0;
  (this->q_infos).m_data[1].count = 0;
  (this->m_defaultAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
  (this->q_items).d.d = (Data *)0x0;
  (this->q_items).d.ptr = (QGridLayoutItem **)0x0;
  (this->q_items).d.size = 0;
  (this->q_grid).d.d = (Data *)0x0;
  (this->q_grid).d.ptr = (QGridLayoutItem **)0x0;
  (this->q_grid).d.size = 0;
  *(undefined8 *)((long)&(this->q_grid).d.size + 4) = 0;
  *(undefined8 *)((long)&(this->q_defaultSpacings).m_data[0].q_value + 4) = 0;
  QHVContainer<QGridLayoutBox>::QHVContainer(&this->q_totalBoxes);
  (this->q_columnData).spacings.d.d = (Data *)0x0;
  (this->q_columnData).spacings.d.ptr = (double *)0x0;
  (this->q_columnData).stretches.d.ptr = (int *)0x0;
  (this->q_columnData).stretches.d.size = 0;
  (this->q_columnData).multiCellMap.d.d.ptr =
       (QMapData<std::map<std::pair<int,_int>,_QGridLayoutMultiCellData,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_QGridLayoutMultiCellData>_>_>_>
        *)0x0;
  (this->q_columnData).stretches.d.d = (Data *)0x0;
  (this->q_columnData).boxes.d.ptr = (QGridLayoutBox *)0x0;
  (this->q_columnData).boxes.d.size = 0;
  (this->q_columnData).spacings.d.size = 0;
  (this->q_columnData).ignore.d.d.size = 0;
  (this->q_columnData).boxes.d.d = (Data *)0x0;
  (this->q_columnData).ignore.d.d.d = (Data *)0x0;
  (this->q_columnData).ignore.d.d.ptr = (char *)0x0;
  (this->q_rowData).ignore.d.d.d = (Data *)0x0;
  (this->q_rowData).ignore.d.d.ptr = (char *)0x0;
  (this->q_rowData).ignore.d.d.size = 0;
  (this->q_rowData).boxes.d.d = (Data *)0x0;
  (this->q_rowData).boxes.d.ptr = (QGridLayoutBox *)0x0;
  (this->q_rowData).boxes.d.size = 0;
  (this->q_rowData).multiCellMap.d.d.ptr =
       (QMapData<std::map<std::pair<int,_int>,_QGridLayoutMultiCellData,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_QGridLayoutMultiCellData>_>_>_>
        *)0x0;
  (this->q_rowData).stretches.d.d = (Data *)0x0;
  (this->q_rowData).stretches.d.ptr = (int *)0x0;
  (this->q_rowData).stretches.d.size = 0;
  (this->q_rowData).spacings.d.d = (Data *)0x0;
  (this->q_rowData).spacings.d.ptr = (double *)0x0;
  (this->q_rowData).spacings.d.size = 0;
  (this->q_cachedSize).wd = -1.0;
  (this->q_cachedSize).ht = -1.0;
  this->m_visualDirection = LeftToRight;
  (this->q_xx).d.d = (Data *)0x0;
  (this->q_xx).d.ptr = (double *)0x0;
  (this->q_xx).d.size = 0;
  (this->q_yy).d.d = (Data *)0x0;
  (this->q_yy).d.ptr = (double *)0x0;
  (this->q_yy).d.size = 0;
  (this->q_widths).d.d = (Data *)0x0;
  (this->q_widths).d.ptr = (double *)0x0;
  (this->q_widths).d.size = 0;
  (this->q_heights).d.d = (Data *)0x0;
  (this->q_descents).d.size = 0;
  (this->q_heights).d.ptr = (double *)0x0;
  (this->q_heights).d.size = 0;
  (this->q_descents).d.d = (Data *)0x0;
  (this->q_descents).d.ptr = (double *)0x0;
  (this->m_defaultAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (Int)defaultAlignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i;
  this->field_0x128 = this->field_0x128 & 0xf8 | snapToPixelGrid;
  invalidate(this);
  return;
}

Assistant:

QGridLayoutEngine::QGridLayoutEngine(Qt::Alignment defaultAlignment, bool snapToPixelGrid)
{
    m_visualDirection = Qt::LeftToRight;
    m_defaultAlignment = defaultAlignment;
    m_snapToPixelGrid = snapToPixelGrid;
    m_uniformCellWidths = false;
    m_uniformCellHeights = false;
    invalidate();
}